

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

Options * __thiscall restincurl::Options::Set<long>(Options *this,CURLoption *opt,long *value)

{
  handle_t pCVar1;
  CurlException *this_00;
  __cxx11 local_a0 [55];
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [36];
  CURLcode local_24;
  long *plStack_20;
  CURLcode ret;
  long *value_local;
  CURLoption *opt_local;
  Options *this_local;
  
  plStack_20 = value;
  value_local = (long *)opt;
  opt_local = (CURLoption *)this;
  pCVar1 = EasyHandle::operator_cast_to_void_(this->eh_);
  local_24 = curl_easy_setopt(pCVar1,(int)*value_local,*plStack_20);
  if (local_24 != CURLE_OK) {
    this_00 = (CurlException *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Setting option ",&local_69);
    std::__cxx11::to_string(local_a0,(int)*value_local);
    std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    CurlException::CurlException(this_00,local_48,local_24);
    __cxa_throw(this_00,&CurlException::typeinfo,CurlException::~CurlException);
  }
  return this;
}

Assistant:

Options& Set(const CURLoption& opt, const T& value) {
            const auto ret = curl_easy_setopt(eh_, opt, value);
            if (ret) {
                throw CurlException(
                    std::string("Setting option ") + std::to_string(opt), ret);
            }
            return *this;
        }